

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void utrie_compact(UNewTrie *trie,UBool overlap,UErrorCode *pErrorCode)

{
  int32_t *__s;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint32_t *puVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (trie->isCompacted == '\0') {
    __s = trie->map;
    memset(__s,0xff,0x22084);
    iVar2 = trie->indexLength;
    if (0 < (long)iVar2) {
      lVar5 = 0;
      do {
        uVar15 = trie->index[lVar5];
        uVar8 = -uVar15;
        if (0 < (int)uVar15) {
          uVar8 = uVar15;
        }
        trie->map[uVar8 >> 5] = 0;
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
    trie->map[0] = 0;
    uVar15 = 0x20;
    if (0x20 < trie->dataLength) {
      uVar8 = (uint)(trie->isLatin1Linear != '\0') << 8 | 0x20;
      lVar5 = 4;
      if (overlap == '\0') {
        lVar5 = 0x20;
      }
      uVar15 = 0x20;
      uVar10 = 0x20;
LAB_002eef36:
      uVar13 = (ulong)(int)uVar10;
      lVar11 = uVar13 * 4;
      do {
        iVar12 = (int)uVar13;
        iVar2 = iVar12 >> 5;
        if (-1 < __s[iVar2]) {
          if (iVar12 < (int)uVar8) goto LAB_002eeff8;
          iVar16 = -1;
          if (0x1f < (int)uVar15) {
            lVar6 = 0;
            lVar9 = 0;
            do {
              puVar7 = trie->data;
              uVar3 = 0x20;
              do {
                if (*(uint32_t *)((long)puVar7 + lVar6) != puVar7[uVar13 & 0xffffffff])
                goto LAB_002eefab;
                puVar7 = puVar7 + 1;
                bVar1 = 1 < uVar3;
                uVar3 = uVar3 - 1;
              } while (bVar1);
              uVar3 = 0;
LAB_002eefab:
              if (uVar3 == 0) {
                iVar16 = (int)lVar9;
                break;
              }
              lVar9 = lVar9 + lVar5;
              lVar6 = lVar6 + (ulong)(uint)((int)lVar5 * 4);
              iVar16 = -1;
            } while (lVar9 <= (int)(uVar15 - 0x20));
          }
          if (iVar16 < 0) goto LAB_002eeff8;
          __s[iVar2] = iVar16;
        }
        uVar13 = uVar13 + 0x20;
        uVar10 = uVar10 + 0x20;
        lVar11 = lVar11 + 0x80;
        if (trie->dataLength <= (int)uVar13) break;
      } while( true );
    }
LAB_002ef132:
    if (0 < trie->indexLength) {
      lVar5 = 0;
      do {
        uVar8 = trie->index[lVar5];
        uVar10 = -uVar8;
        if (0 < (int)uVar8) {
          uVar10 = uVar8;
        }
        trie->index[lVar5] = trie->map[uVar10 >> 5];
        lVar5 = lVar5 + 1;
      } while (lVar5 < trie->indexLength);
    }
    trie->dataLength = uVar15;
  }
  return;
LAB_002eeff8:
  iVar16 = 0;
  if ((overlap != '\0') && ((int)uVar8 <= iVar12)) {
    lVar6 = (long)(int)uVar15 * 4 + -0x70;
    uVar13 = 0x1c;
    do {
      uVar4 = uVar13 & 0xffffffff;
      puVar7 = trie->data;
      do {
        iVar14 = (int)uVar4;
        if (*(uint32_t *)((long)puVar7 + lVar6) != puVar7[uVar10]) goto LAB_002ef047;
        puVar7 = puVar7 + 1;
        uVar4 = (ulong)(iVar14 - 1);
      } while (1 < iVar14);
      iVar14 = 0;
LAB_002ef047:
      if (iVar14 == 0) {
        iVar16 = (int)uVar13;
        break;
      }
      lVar6 = lVar6 + 0x10;
      bVar1 = 4 < uVar13;
      uVar13 = uVar13 - 4;
    } while (bVar1);
  }
  if (iVar16 < 1) {
    if ((int)uVar15 < iVar12) {
      trie->map[iVar2] = uVar15;
      puVar7 = trie->data;
      lVar6 = 0;
      iVar2 = 0;
      do {
        *(undefined4 *)((long)puVar7 + lVar6 + (long)(int)uVar15 * 4) =
             *(undefined4 *)((long)puVar7 + lVar6 + lVar11);
        lVar6 = lVar6 + 4;
        iVar12 = iVar2 + -1;
        uVar3 = iVar2 + 0x20;
        iVar2 = iVar12;
      } while (1 < uVar3);
      uVar10 = uVar10 - iVar12;
      uVar15 = uVar15 - iVar12;
    }
    else {
      __s[iVar2] = iVar12;
      uVar10 = uVar15 + 0x20;
      uVar15 = uVar10;
    }
  }
  else {
    __s[iVar2] = uVar15 - iVar16;
    if (iVar16 < 0x20) {
      puVar7 = trie->data;
      iVar2 = 0;
      do {
        puVar7[(int)uVar15] = puVar7[(int)(uVar10 + iVar16)];
        puVar7 = puVar7 + 1;
        iVar12 = iVar2 + -1;
        iVar14 = iVar2 - iVar16;
        iVar2 = iVar12;
      } while (1 < iVar14 + 0x20);
      uVar10 = (uVar10 + iVar16) - iVar12;
      uVar15 = uVar15 - iVar12;
    }
    else {
      uVar10 = iVar16 + iVar12;
    }
  }
  if (trie->dataLength <= (int)uVar10) goto LAB_002ef132;
  goto LAB_002eef36;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }